

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
static_resources(static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *this,allocator_type *alloc)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::MyHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>_>
  *puVar1;
  pointer *__ptr;
  long *local_58;
  string local_50 [32];
  
  puVar1 = &this->functions_;
  (this->unary_operators_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unary_operators_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->temp_json_values_).
  super__Vector_base<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unary_operators_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temp_json_values_).
  super__Vector_base<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temp_json_values_).
  super__Vector_base<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->const_selectors_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->const_selectors_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->selectors_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->const_selectors_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectors_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectors_).
  super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functions_)._M_h._M_buckets = &(this->functions_)._M_h._M_single_bucket;
  (this->functions_)._M_h._M_bucket_count = 1;
  (this->functions_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functions_)._M_h._M_element_count = 0;
  (this->functions_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functions_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functions_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->custom_functions_)._M_h._M_buckets = &(this->custom_functions_)._M_h._M_single_bucket;
  (this->custom_functions_)._M_h._M_bucket_count = 1;
  (this->custom_functions_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->custom_functions_)._M_h._M_element_count = 0;
  (this->custom_functions_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->custom_functions_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->custom_functions_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"abs",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::abs_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::abs_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::abs_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"contains",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::contains_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::contains_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::contains_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"starts_with",(allocator<char> *)this)
  ;
  std::
  make_unique<jsoncons::jsonpath::detail::starts_with_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::starts_with_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::starts_with_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"ends_with",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::ends_with_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::ends_with_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::ends_with_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"ceil",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::ceil_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::ceil_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::ceil_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"floor",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::floor_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::floor_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::floor_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"to_number",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::to_number_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::to_number_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::to_number_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"sum",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::sum_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::sum_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::sum_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"prod",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::prod_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::prod_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::prod_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"avg",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::avg_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::avg_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::avg_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"min",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::min_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::min_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::min_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"max",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::max_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::max_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::max_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"length",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::length_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::length_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::length_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"keys",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::keys_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<char>&>
            ((allocator<char> *)&local_58);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::keys_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::keys_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"tokenize",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::tokenize_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<char>&>
            ((allocator<char> *)&local_58);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::tokenize_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::tokenize_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"count",(allocator<char> *)this);
  std::
  make_unique<jsoncons::jsonpath::detail::length_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            ();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::__cxx11::string,std::unique_ptr<jsoncons::jsonpath::detail::length_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::length_function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::function_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::MyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)puVar1,local_50,&local_58);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

static_resources(const allocator_type& alloc = allocator_type())
            : alloc_(alloc)
        {
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "abs"), alloc_}, 
                    jsoncons::make_unique<abs_function<Json>>());
                functions_.emplace(string_type{ JSONCONS_CSTRING_CONSTANT(char_type, "contains"), alloc_ },
                    jsoncons::make_unique<contains_function<Json>>());
                functions_.emplace(string_type{ JSONCONS_CSTRING_CONSTANT(char_type, "starts_with"), alloc_ },
                    jsoncons::make_unique<starts_with_function<Json>>());
                functions_.emplace(string_type{ JSONCONS_CSTRING_CONSTANT(char_type, "ends_with"), alloc_ },
                    jsoncons::make_unique<ends_with_function<Json>>());
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "ceil"), alloc_}, 
                    jsoncons::make_unique<ceil_function<Json>>());
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "floor"), alloc_}, 
                    jsoncons::make_unique<floor_function<Json>>());
                functions_.emplace(string_type{ JSONCONS_CSTRING_CONSTANT(char_type, "to_number"), alloc_ },
                    jsoncons::make_unique<to_number_function<Json>>());
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "sum"), alloc_}, 
                    jsoncons::make_unique<sum_function<Json>>());
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "prod"), alloc_}, 
                    jsoncons::make_unique<prod_function<Json>>());
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "avg"), alloc_}, 
                    jsoncons::make_unique<avg_function<Json>>());
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "min"), alloc_}, 
                    jsoncons::make_unique<min_function<Json>>());
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "max"), alloc_}, 
                    jsoncons::make_unique<max_function<Json>>());
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "length"), alloc_}, 
                    jsoncons::make_unique<length_function<Json>>());
                functions_.emplace(string_type{ JSONCONS_CSTRING_CONSTANT(char_type, "keys"), alloc_ },
                    jsoncons::make_unique<keys_function<Json>>(alloc_));
#if defined(JSONCONS_HAS_STD_REGEX)
                functions_.emplace(string_type{ JSONCONS_CSTRING_CONSTANT(char_type, "tokenize"), alloc_ },
                    jsoncons::make_unique<tokenize_function<Json>>(alloc_));
#endif
                functions_.emplace(string_type{JSONCONS_CSTRING_CONSTANT(char_type, "count"), alloc_}, 
                    jsoncons::make_unique<length_function<Json>>());
        }